

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtilizationWidget.cpp
# Opt level: O2

void __thiscall UtilizationWidget::drawGrid(UtilizationWidget *this)

{
  QSize QVar1;
  QSize QVar2;
  int iVar3;
  QPainter *this_00;
  int i;
  int iVar4;
  
  QVar1 = QWidget::size(&this->super_QWidget);
  QVar2 = QWidget::size(&this->super_QWidget);
  this_00 = &this->painter;
  QPainter::setPen((QColor *)this_00);
  for (iVar4 = 0; iVar4 != 5; iVar4 = iVar4 + 1) {
    iVar3 = (int)((float)iVar4 * 0.25 * (float)QVar2.wd);
    QPainter::drawLine(this_00,iVar3,0,iVar3,QVar1.ht);
    iVar3 = (int)((float)iVar4 * 0.25 * (float)QVar1.ht);
    QPainter::drawLine(this_00,0,iVar3,QVar2.wd,iVar3);
  }
  return;
}

Assistant:

void UtilizationWidget::drawGrid() {
    const int graphHeight = size().height();
    const int graphWidth = size().width();

    painter.setPen(QColor(100, 100, 100));

    for (int i = 0; i <= 4; ++i) {
        float k = (float) i / 4.0f;
        painter.drawLine(graphWidth * k, 0, graphWidth * k, graphHeight); // vertical
        painter.drawLine(0, graphHeight * k, graphWidth, graphHeight * k); // horizontal
    }
}